

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

int bundle_remove_conn(connectbundle *cb_ptr,connectdata *conn)

{
  int in_EAX;
  int extraout_EAX;
  curl_llist_element *e;
  
  e = (cb_ptr->conn_list).head;
  if (e != (curl_llist_element *)0x0) {
    do {
      if ((connectdata *)e->ptr == conn) {
        Curl_llist_remove(&cb_ptr->conn_list,e,(void *)0x0);
        cb_ptr->num_connections = cb_ptr->num_connections - 1;
        conn->bundle = (connectbundle *)0x0;
        return extraout_EAX;
      }
      e = e->next;
    } while (e != (curl_llist_element *)0x0);
  }
  return in_EAX;
}

Assistant:

static int bundle_remove_conn(struct connectbundle *cb_ptr,
                              struct connectdata *conn)
{
  struct curl_llist_element *curr;

  curr = cb_ptr->conn_list.head;
  while(curr) {
    if(curr->ptr == conn) {
      Curl_llist_remove(&cb_ptr->conn_list, curr, NULL);
      cb_ptr->num_connections--;
      conn->bundle = NULL;
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }
  return 0;
}